

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_crl.c
# Opt level: O0

int crl_cb(int operation,ASN1_VALUE **pval,ASN1_ITEM *it,void *exarg)

{
  int iVar1;
  int iVar2;
  EVP_MD *type;
  ISSUING_DIST_POINT *pIVar3;
  AUTHORITY_KEYID *pAVar4;
  ASN1_INTEGER *pAVar5;
  OPENSSL_STACK *pOVar6;
  ASN1_OBJECT *o;
  undefined8 *in_RSI;
  undefined4 in_EDI;
  X509_CRL *old;
  int nid;
  int i;
  int idx;
  X509_EXTENSION *ext;
  stack_st_X509_EXTENSION *exts;
  X509_CRL *crl;
  OPENSSL_sk_freefunc in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  X509_CRL *in_stack_ffffffffffffff98;
  X509_CRL *data;
  X509_CRL *in_stack_ffffffffffffffa0;
  int local_40;
  int local_3c;
  X509_EXTENSION *local_38;
  stack_st_X509_EXTENSION *local_30;
  X509_CRL *crl_00;
  
  data = (X509_CRL *)*in_RSI;
  switch(in_EDI) {
  case 3:
    if ((data->meth->crl_free != (_func_int_X509_CRL_ptr *)0x0) &&
       (iVar2 = (*data->meth->crl_free)(data), iVar2 == 0)) {
      return 0;
    }
    AUTHORITY_KEYID_free((AUTHORITY_KEYID *)data->akid);
    ISSUING_DIST_POINT_free((ISSUING_DIST_POINT *)data->idp);
    ASN1_INTEGER_free((ASN1_INTEGER *)data->crl_number);
    ASN1_INTEGER_free((ASN1_INTEGER *)data->base_crl_number);
    pOVar6 = ossl_check_GENERAL_NAMES_sk_type(data->issuers);
    ossl_check_GENERAL_NAMES_freefunc_type(GENERAL_NAMES_free);
    OPENSSL_sk_pop_free((OPENSSL_STACK *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        (OPENSSL_sk_freefunc)pOVar6);
    CRYPTO_free(data->propq);
    break;
  case 4:
    if ((data->meth->crl_free != (_func_int_X509_CRL_ptr *)0x0) &&
       (iVar2 = (*data->meth->crl_free)(data), iVar2 == 0)) {
      return 0;
    }
    AUTHORITY_KEYID_free((AUTHORITY_KEYID *)data->akid);
    ISSUING_DIST_POINT_free((ISSUING_DIST_POINT *)data->idp);
    ASN1_INTEGER_free((ASN1_INTEGER *)data->crl_number);
    ASN1_INTEGER_free((ASN1_INTEGER *)data->base_crl_number);
    ossl_check_GENERAL_NAMES_sk_type(data->issuers);
    ossl_check_GENERAL_NAMES_freefunc_type(GENERAL_NAMES_free);
    OPENSSL_sk_pop_free((OPENSSL_STACK *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88);
  case 1:
    data->idp = (ISSUING_DIST_POINT *)0x0;
    data->akid = (AUTHORITY_KEYID *)0x0;
    data->flags = 0;
    data->idp_flags = 0;
    data->idp_reasons = 0x807f;
    data->meth = default_crl_method;
    data->meth_data = (void *)0x0;
    data->issuers = (stack_st_GENERAL_NAMES *)0x0;
    data->crl_number = (ASN1_INTEGER *)0x0;
    data->base_crl_number = (ASN1_INTEGER *)0x0;
    break;
  case 5:
    crl_00 = data;
    type = EVP_sha1();
    iVar2 = X509_CRL_digest((X509_CRL *)data,type,crl_00->sha1_hash,(uint *)0x0);
    if (iVar2 == 0) {
      crl_00->flags = crl_00->flags | 0x100000;
    }
    pIVar3 = (ISSUING_DIST_POINT *)
             X509_CRL_get_ext_d2i((X509_CRL *)crl_00,0x302,&local_40,(int *)0x0);
    crl_00->idp = pIVar3;
    if (crl_00->idp == (ISSUING_DIST_POINT *)0x0) {
      if (local_40 != -1) {
        crl_00->flags = crl_00->flags | 0x80;
      }
    }
    else {
      iVar2 = setup_idp(in_stack_ffffffffffffffa0,(ISSUING_DIST_POINT *)data);
      if (iVar2 == 0) {
        crl_00->flags = crl_00->flags | 0x80;
      }
    }
    pAVar4 = (AUTHORITY_KEYID *)X509_CRL_get_ext_d2i((X509_CRL *)crl_00,0x5a,&local_40,(int *)0x0);
    crl_00->akid = pAVar4;
    if ((crl_00->akid == (AUTHORITY_KEYID *)0x0) && (local_40 != -1)) {
      crl_00->flags = crl_00->flags | 0x80;
    }
    pAVar5 = (ASN1_INTEGER *)X509_CRL_get_ext_d2i((X509_CRL *)crl_00,0x58,&local_40,(int *)0x0);
    crl_00->crl_number = pAVar5;
    if ((crl_00->crl_number == (ASN1_INTEGER *)0x0) && (local_40 != -1)) {
      crl_00->flags = crl_00->flags | 0x80;
    }
    pAVar5 = (ASN1_INTEGER *)X509_CRL_get_ext_d2i((X509_CRL *)crl_00,0x8c,&local_40,(int *)0x0);
    crl_00->base_crl_number = pAVar5;
    if ((crl_00->base_crl_number == (ASN1_INTEGER *)0x0) && (local_40 != -1)) {
      crl_00->flags = crl_00->flags | 0x80;
    }
    if ((crl_00->base_crl_number != (ASN1_INTEGER *)0x0) &&
       (crl_00->crl_number == (ASN1_INTEGER *)0x0)) {
      crl_00->flags = crl_00->flags | 0x80;
    }
    local_30 = (crl_00->crl).extensions;
    local_3c = 0;
    while( true ) {
      iVar2 = local_3c;
      pOVar6 = ossl_check_const_X509_EXTENSION_sk_type(local_30);
      iVar1 = OPENSSL_sk_num(pOVar6);
      if (iVar1 <= iVar2) break;
      pOVar6 = ossl_check_const_X509_EXTENSION_sk_type(local_30);
      local_38 = (X509_EXTENSION *)OPENSSL_sk_value(pOVar6,local_3c);
      o = X509_EXTENSION_get_object(local_38);
      iVar2 = OBJ_obj2nid(o);
      if (iVar2 == 0x359) {
        crl_00->flags = crl_00->flags | 0x1000;
      }
      iVar1 = X509_EXTENSION_get_critical(local_38);
      if ((((iVar1 != 0) && (iVar2 != 0x302)) && (iVar2 != 0x5a)) && (iVar2 != 0x8c)) {
        crl_00->flags = crl_00->flags | 0x200;
        break;
      }
      local_3c = local_3c + 1;
    }
    iVar2 = crl_set_issuers(crl_00);
    if (iVar2 == 0) {
      return 0;
    }
    if ((crl_00->meth->crl_init != (_func_int_X509_CRL_ptr *)0x0) &&
       (iVar2 = (*crl_00->meth->crl_init)(crl_00), iVar2 == 0)) {
      return 0;
    }
    crl_00->flags = crl_00->flags | 0x100;
    break;
  case 0xf:
    iVar2 = ossl_x509_crl_set0_libctx
                      (in_stack_ffffffffffffff98,
                       (OSSL_LIB_CTX *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                       ,(char *)in_stack_ffffffffffffff88);
    if (iVar2 == 0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int crl_cb(int operation, ASN1_VALUE **pval, const ASN1_ITEM *it,
                  void *exarg)
{
    X509_CRL *crl = (X509_CRL *)*pval;
    STACK_OF(X509_EXTENSION) *exts;
    X509_EXTENSION *ext;
    int idx, i;

    switch (operation) {
    case ASN1_OP_D2I_PRE:
        if (crl->meth->crl_free) {
            if (!crl->meth->crl_free(crl))
                return 0;
        }
        AUTHORITY_KEYID_free(crl->akid);
        ISSUING_DIST_POINT_free(crl->idp);
        ASN1_INTEGER_free(crl->crl_number);
        ASN1_INTEGER_free(crl->base_crl_number);
        sk_GENERAL_NAMES_pop_free(crl->issuers, GENERAL_NAMES_free);
        /* fall thru */

    case ASN1_OP_NEW_POST:
        crl->idp = NULL;
        crl->akid = NULL;
        crl->flags = 0;
        crl->idp_flags = 0;
        crl->idp_reasons = CRLDP_ALL_REASONS;
        crl->meth = default_crl_method;
        crl->meth_data = NULL;
        crl->issuers = NULL;
        crl->crl_number = NULL;
        crl->base_crl_number = NULL;
        break;

    case ASN1_OP_D2I_POST:
        if (!X509_CRL_digest(crl, EVP_sha1(), crl->sha1_hash, NULL))
            crl->flags |= EXFLAG_NO_FINGERPRINT;
        crl->idp = X509_CRL_get_ext_d2i(crl,
                                        NID_issuing_distribution_point, &i,
                                        NULL);
        if (crl->idp != NULL) {
            if (!setup_idp(crl, crl->idp))
                crl->flags |= EXFLAG_INVALID;
        }
        else if (i != -1) {
            crl->flags |= EXFLAG_INVALID;
        }

        crl->akid = X509_CRL_get_ext_d2i(crl,
                                         NID_authority_key_identifier, &i,
                                         NULL);
        if (crl->akid == NULL && i != -1)
            crl->flags |= EXFLAG_INVALID;

        crl->crl_number = X509_CRL_get_ext_d2i(crl,
                                               NID_crl_number, &i, NULL);
        if (crl->crl_number == NULL && i != -1)
            crl->flags |= EXFLAG_INVALID;

        crl->base_crl_number = X509_CRL_get_ext_d2i(crl,
                                                    NID_delta_crl, &i,
                                                    NULL);
        if (crl->base_crl_number == NULL && i != -1)
            crl->flags |= EXFLAG_INVALID;
        /* Delta CRLs must have CRL number */
        if (crl->base_crl_number && !crl->crl_number)
            crl->flags |= EXFLAG_INVALID;

        /*
         * See if we have any unhandled critical CRL extensions and indicate
         * this in a flag. We only currently handle IDP so anything else
         * critical sets the flag. This code accesses the X509_CRL structure
         * directly: applications shouldn't do this.
         */

        exts = crl->crl.extensions;

        for (idx = 0; idx < sk_X509_EXTENSION_num(exts); idx++) {
            int nid;
            ext = sk_X509_EXTENSION_value(exts, idx);
            nid = OBJ_obj2nid(X509_EXTENSION_get_object(ext));
            if (nid == NID_freshest_crl)
                crl->flags |= EXFLAG_FRESHEST;
            if (X509_EXTENSION_get_critical(ext)) {
                /* We handle IDP and deltas */
                if ((nid == NID_issuing_distribution_point)
                    || (nid == NID_authority_key_identifier)
                    || (nid == NID_delta_crl))
                    continue;
                crl->flags |= EXFLAG_CRITICAL;
                break;
            }
        }

        if (!crl_set_issuers(crl))
            return 0;

        if (crl->meth->crl_init) {
            if (crl->meth->crl_init(crl) == 0)
                return 0;
        }

        crl->flags |= EXFLAG_SET;
        break;

    case ASN1_OP_FREE_POST:
        if (crl->meth->crl_free) {
            if (!crl->meth->crl_free(crl))
                return 0;
        }
        AUTHORITY_KEYID_free(crl->akid);
        ISSUING_DIST_POINT_free(crl->idp);
        ASN1_INTEGER_free(crl->crl_number);
        ASN1_INTEGER_free(crl->base_crl_number);
        sk_GENERAL_NAMES_pop_free(crl->issuers, GENERAL_NAMES_free);
        OPENSSL_free(crl->propq);
        break;
    case ASN1_OP_DUP_POST:
        {
            X509_CRL *old = exarg;

            if (!ossl_x509_crl_set0_libctx(crl, old->libctx, old->propq))
                return 0;
        }
        break;
    }
    return 1;
}